

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkparts.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  fourcc_t fVar7;
  stream *psVar8;
  bool_t bVar9;
  stream *Element;
  ebml_context *peVar10;
  filepos_t fVar11;
  stream *Element_00;
  filepos_t fVar12;
  stream *psVar13;
  tchar_t *ptVar14;
  long lVar15;
  char *ErrString;
  int ErrCode;
  textwriter *ptVar16;
  size_t j;
  ulong uVar17;
  int UpperElement;
  undefined1 local_12f8 [32];
  ebml_parser_context RContext;
  textwriter _StdErr;
  parsercontext p;
  tchar_t Ext [256];
  tchar_t Path [1024];
  tchar_t OutPath [1024];
  tchar_t String [1024];
  tchar_t Original [1024];
  
  ParserContext_Init(&p,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
  (**(code **)((long)p.Base.Base.Base.VMT + 0x40))(&p,0x101,4,"Matroska");
  (**(code **)((long)p.Base.Base.Base.VMT + 0x40))(&p,0x102,4,"0.1.0");
  (**(code **)((long)p.Base.Base.Base.VMT + 0x40))(&p,0x100,4,"mkparts");
  MATROSKA_Init(&p);
  local_12f8._0_8_ = (char *)0x0;
  local_12f8._8_8_ = (void *)0x0;
  StdErr = &_StdErr;
  _StdErr.Stream = (stream *)0x0;
  _StdErr.CC = (charconv *)0x0;
  _StdErr.SafeFormat = 0;
  _StdErr.Element = (tchar_t *)0x0;
  _StdErr.Deep = 0;
  _StdErr._36_4_ = 0;
  _StdErr.HasChild = 0;
  _StdErr.InsideContent = 0;
  psVar8 = (stream *)NodeSingleton(&p,0x45445453);
  StdErr->Stream = psVar8;
  if (psVar8 == (stream *)0x0) {
    __assert_fail("StdErr->Stream!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkparts/mkparts.c"
                  ,0xac,"int main(int, const char **)");
  }
  local_12f8._16_8_ = SEXT48(argc + -1);
  bVar1 = false;
  local_12f8._24_8_ = (ulong)(uint)argc;
  bVar3 = false;
  for (lVar15 = 1; lVar15 < argc; lVar15 = lVar15 + 1) {
    Node_FromStr(&p,Path,0x400,argv[lVar15]);
    bVar9 = tcsisame_ascii(Path,"--split");
    bVar5 = bVar1;
    bVar2 = bVar3;
    if (bVar9 == 0) {
      bVar9 = tcsisame_ascii(Path,"--version");
      if (bVar9 == 0) {
        bVar9 = tcsisame_ascii(Path,"--quiet");
        if (bVar9 == 0) {
          bVar9 = tcsisame_ascii(Path,"--help");
          bVar5 = true;
          bVar2 = true;
          if ((bVar9 == 0) && (bVar5 = bVar1, bVar2 = bVar3, lVar15 < (long)local_12f8._16_8_)) {
            TextPrintf((textwriter_conflict *)StdErr,"Unknown parameter \'%s\'\r\n",Path);
          }
        }
        else {
          Quiet = '\x01';
        }
      }
      else {
        bVar5 = true;
      }
    }
    bVar1 = bVar5;
    bVar3 = bVar2;
  }
  iVar6 = (int)local_12f8._24_8_;
  if (bVar1 || iVar6 < 2) {
    TextWrite((textwriter_conflict *)StdErr,
              "mkparts v0.1.0, Copyright (c) 2011-2020 Matroska Foundation\r\n");
    if (bVar3 || iVar6 < 2) {
      iVar6 = OutputError(1,"Usage: mkparts [options] <matroska_src>");
      TextWrite((textwriter_conflict *)StdErr,"Options:\r\n");
      TextWrite((textwriter_conflict *)StdErr,
                "  --split     split concatenated segments into different files\r\n");
      TextWrite((textwriter_conflict *)StdErr,
                "  --quiet     don\'t ouput progress and file info\r\n");
      TextWrite((textwriter_conflict *)StdErr,"  --version   show the version of mkparts\r\n");
      TextWrite((textwriter_conflict *)StdErr,"  --help      show this screen\r\n");
    }
    else {
      iVar6 = 0;
    }
  }
  else {
    Node_FromStr(&p,Path,0x400,argv[(local_12f8._24_8_ & 0xffffffff) - 1]);
    psVar8 = StreamOpen(&p,Path,1);
    if (psVar8 != (stream *)0x0) {
      RContext.Context = MATROSKA_getContextStream();
      RContext.EndPosition = -1;
      RContext.UpContext = (ebml_parser_context *)0x0;
      RContext.Profile = -1;
      psVar13 = psVar8;
      Element = (stream *)EBML_FindNextElement(psVar8,&RContext,&UpperElement,0);
      iVar6 = 0;
LAB_001058df:
      ErrCode = (int)psVar13;
      if (Element != (stream *)0x0) {
        peVar10 = MATROSKA_getContextSegment();
        bVar9 = EBML_ElementIsType((ebml_element *)Element,peVar10);
        if (bVar9 == 0) {
          peVar10 = EBML_getContextHead();
          bVar9 = EBML_ElementIsType((ebml_element *)Element,peVar10);
          if (bVar9 == 0) {
            fVar7 = EBML_ElementClassID((ebml_element *)Element);
            psVar13 = Element;
            fVar11 = EBML_ElementPosition((ebml_element *)Element);
            OutputWarning((int)psVar13,"Unknown element %x at %ld in %s",(ulong)fVar7,fVar11,Path);
            goto LAB_0010591e;
          }
        }
        else {
          psVar13 = Element;
          fVar11 = EBML_ElementPosition((ebml_element *)Element);
          OutputWarning((int)psVar13,"Matroska Segment at %ld in %s without an EBML header",fVar11);
LAB_0010591e:
          iVar6 = -3;
        }
        if (Quiet == '\0') {
          TextWrite((textwriter_conflict *)StdErr,".");
        }
        do {
          Element_00 = (stream *)EBML_FindNextElement(psVar8,&RContext,&UpperElement,0);
          peVar10 = EBML_getContextHead();
          psVar13 = Element_00;
          bVar9 = EBML_ElementIsType((ebml_element *)Element_00,peVar10);
          if (bVar9 != 0) {
            fVar11 = EBML_ElementPosition((ebml_element *)Element_00);
            fVar12 = EBML_ElementPosition((ebml_element *)Element);
            psVar13 = Element;
            OutputWarning((int)Element,
                          "Found a new EBML header at %ld instead of a segment after EBML Header at %ld in %s"
                          ,fVar11,fVar12,Path);
            iVar6 = -3;
            Element = Element_00;
          }
          if (Element_00 == (stream *)0x0) goto LAB_00105b2c;
          peVar10 = MATROSKA_getContextSegment();
          bVar9 = EBML_ElementIsType((ebml_element *)Element_00,peVar10);
        } while (bVar9 == 0);
        peVar10 = MATROSKA_getContextSegment();
        psVar13 = Element_00;
        bVar9 = EBML_ElementIsType((ebml_element *)Element_00,peVar10);
        if ((bVar9 != 0) && (Element != (stream *)0x0)) goto code_r0x00105a05;
        goto LAB_00105b2c;
      }
      if (Quiet == '\0') {
        ptVar16 = StdErr;
        TextWrite((textwriter_conflict *)StdErr,"\r\n");
        ErrCode = (int)ptVar16;
      }
      if ((ulong)local_12f8._8_8_ < (void *)0x20) {
        ErrString = "No segment found in %s";
        iVar6 = 3;
        ptVar14 = Path;
LAB_00105ba2:
        psVar13 = (stream *)0x0;
        iVar6 = OutputError(iVar6,ErrString,ptVar14);
      }
      else if ((local_12f8._8_8_ & 0xffffffffffffffe0) == 0x20) {
        psVar13 = (stream *)0x0;
        OutputWarning(ErrCode,"Only one segment found in %s, do nothing",Path);
        iVar6 = -3;
      }
      else {
        lVar15 = 0x18;
        psVar13 = (stream *)0x0;
        for (uVar17 = 0; uVar4 = local_12f8._0_8_, uVar17 < (ulong)local_12f8._8_8_ >> 5;
            uVar17 = uVar17 + 1) {
          if (Quiet == '\0') {
            TextPrintf((textwriter_conflict *)StdErr,
                       "write segment %zu from %s %ld size %ld in %s\r\n",uVar17,Path,
                       *(undefined8 *)(local_12f8._0_8_ + lVar15 + -0x18),
                       *(long *)(local_12f8._0_8_ + lVar15) +
                       *(long *)(local_12f8._0_8_ + lVar15 + -0x10),Path);
          }
          SplitPath(Path,Original,0x400,String,0x400,Ext,0x100);
          if (Original[0] == '\0') {
            OutPath._0_8_ = OutPath._0_8_ & 0xffffffffffffff00;
          }
          else {
            tcscpy_s(OutPath,0x400,Original);
            AddPathDelimiter(OutPath,0x400);
          }
          if (Ext[0] == '\0') {
            stcatprintf_s(OutPath,0x400,"%zu.%s",uVar17,String);
          }
          else {
            stcatprintf_s(OutPath,0x400,"%s.%zu.%s",String,uVar17,Ext);
          }
          psVar13 = StreamOpen(&p,OutPath,6);
          if (psVar13 == (stream *)0x0) {
            ErrString = "Could not open file \"%s\" for writing\r\n";
            iVar6 = 5;
            ptVar14 = OutPath;
            goto LAB_00105ba2;
          }
          CopyTo(psVar8,psVar13,*(filepos_t *)(uVar4 + lVar15 + -0x18),
                 *(filepos_t *)(uVar4 + lVar15 + -0x10));
          CopyTo(psVar8,psVar13,*(filepos_t *)(uVar4 + lVar15 + -8),*(filepos_t *)(uVar4 + lVar15));
          StreamClose(psVar13);
          lVar15 = lVar15 + 0x20;
        }
      }
      goto LAB_00105bdb;
    }
    TextPrintf((textwriter_conflict *)StdErr,"Could not open file \"%s\" for reading\r\n",Path);
    iVar6 = -2;
  }
  psVar8 = (stream *)0x0;
  psVar13 = (stream *)0x0;
LAB_00105bdb:
  ArrayClear((array *)local_12f8);
  if (psVar8 != (stream *)0x0) {
    StreamClose(psVar8);
  }
  if (psVar13 != (stream *)0x0) {
    StreamClose(psVar13);
  }
  ParserContext_Done(&p);
  return iVar6;
code_r0x00105a05:
  peVar10 = EBML_getContextHead();
  psVar13 = Element;
  bVar9 = EBML_ElementIsType((ebml_element *)Element,peVar10);
  if (bVar9 != 0) {
    OutPath._0_8_ = EBML_ElementPosition((ebml_element *)Element);
    OutPath._16_8_ = EBML_ElementPosition((ebml_element *)Element_00);
    bVar9 = EBML_ElementIsFiniteSize((ebml_element *)Element);
    if (bVar9 == 0) {
      fVar11 = EBML_ElementPosition((ebml_element *)Element_00);
      fVar12 = EBML_ElementPosition((ebml_element *)Element);
      OutPath._8_8_ = fVar11 - fVar12;
    }
    else {
      OutPath._8_8_ = EBML_ElementFullSize((ebml_element *)Element,1);
    }
    NodeDelete(&Element->Base);
    Element = (stream *)
              EBML_ElementSkipData
                        ((ebml_element *)Element_00,psVar8,&RContext,(ebml_element *)0x0,1);
    bVar9 = EBML_ElementIsFiniteSize((ebml_element *)Element_00);
    if (bVar9 == 0) {
      if (Element == (stream *)0x0) {
        OutPath._24_8_ = (**(code **)((long)(psVar8->Base).VMT + 0x78))(psVar8,0,1);
      }
      else {
        fVar11 = EBML_ElementPosition((ebml_element *)Element);
        fVar12 = EBML_ElementPosition((ebml_element *)Element_00);
        OutPath._24_8_ = fVar11 - fVar12;
      }
    }
    else {
      OutPath._24_8_ = EBML_ElementFullSize((ebml_element *)Element_00,1);
    }
    NodeDelete((node *)Element_00);
    psVar13 = (stream *)local_12f8;
    ArrayAppend((array *)psVar13,OutPath,0x20,0);
LAB_00105b2c:
    if (Element == (stream *)0x0) {
      psVar13 = psVar8;
      Element = (stream *)EBML_FindNextElement(psVar8,&RContext,&UpperElement,0);
    }
  }
  goto LAB_001058df;
}

Assistant:

int main(int argc, const char *argv[])
{
    int Result = 0;
    int ShowUsage = 0;
    int ShowVersion = 0;
    parsercontext p;
    textwriter _StdErr;
    struct stream *Input = NULL, *Output = NULL;
    tchar_t Path[MAXPATHFULL];
    ebml_element *EbmlHead = NULL;
    ebml_parser_context RContext;
    int i,UpperElement;
    array SegmentStarts;

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VENDOR,TYPE_STRING,"Matroska");
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VERSION,TYPE_STRING,PROJECT_VERSION);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_NAME,TYPE_STRING,PROJECT_NAME);

    // EBML & Matroska Init
    MATROSKA_Init(&p);

    ArrayInit(&SegmentStarts);

    StdErr = &_StdErr;
    memset(StdErr,0,sizeof(_StdErr));
    StdErr->Stream = (struct stream*)NodeSingleton(&p,STDERR_ID);
    assert(StdErr->Stream!=NULL);

	for (i=1;i<argc;++i)
	{
	    Node_FromStr(&p,Path,TSIZEOF(Path),argv[i]);
		if (tcsisame_ascii(Path,T("--split"))) Split = 1;
		else if (tcsisame_ascii(Path,T("--version"))) ShowVersion = 1;
		else if (tcsisame_ascii(Path,T("--quiet"))) Quiet = 1;
        else if (tcsisame_ascii(Path,T("--help"))) {ShowVersion = 1; ShowUsage = 1;}
		else if (i<argc-1) TextPrintf(StdErr,T("Unknown parameter '%s'\r\n"),Path);
	}

    if (argc < 2 || ShowVersion)
    {
        TextWrite(StdErr,PROJECT_NAME T(" v") PROJECT_VERSION T(", Copyright (c) 2011-2020 Matroska Foundation\r\n"));
        if (argc < 2 || ShowUsage)
        {
            Result = OutputError(1,T("Usage: ") PROJECT_NAME T(" [options] <matroska_src>"));
		    TextWrite(StdErr,T("Options:\r\n"));
		    TextWrite(StdErr,T("  --split     split concatenated segments into different files\r\n"));
            TextWrite(StdErr,T("  --quiet     don't ouput progress and file info\r\n"));
            TextWrite(StdErr,T("  --version   show the version of ") PROJECT_NAME T("\r\n"));
            TextWrite(StdErr,T("  --help      show this screen\r\n"));
        }
        goto exit;
    }

    Node_FromStr(&p,Path,TSIZEOF(Path),argv[argc-1]);
    Input = StreamOpen(&p,Path,SFLAG_RDONLY/*|SFLAG_BUFFERED*/);
    if (!Input)
    {
        TextPrintf(StdErr,T("Could not open file \"%s\" for reading\r\n"),Path);
        Result = -2;
        goto exit;
    }

    if (!Split)
    {
        TextPrintf(StdErr,T("Only the --split option is supported for the moment\r\n"));
        Result = -3;
        goto exit;
    }

    // parse the source file to determine if it's a Matroska file and determine the location of the key parts
    RContext.Context = MATROSKA_getContextStream();
    RContext.EndPosition = INVALID_FILEPOS_T;
    RContext.UpContext = NULL;
    RContext.Profile = EBML_ANY_PROFILE;

    EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    while (EbmlHead!=NULL)
    {
        // parse the list of EBML header+segment start points in memory
        ebml_element *Segment = NULL;

        if (EL_Type(EbmlHead, MATROSKA_getContextSegment()))
        {
            Result |= OutputWarning(3,T("Matroska Segment at %") TPRId64 T(" in %s without an EBML header"),EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }
        else if (!EL_Type(EbmlHead, EBML_getContextHead()))
        {
            Result |= OutputWarning(3,T("Unknown element %x at %") TPRId64 T(" in %s"), EBML_ElementClassID(EbmlHead), EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }

        if (!Quiet) TextWrite(StdErr,T("."));

        do {
            Segment = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
            if (EL_Type(Segment, EBML_getContextHead()))
            {
                Result |= OutputWarning(3,T("Found a new EBML header at %") TPRId64 T(" instead of a segment after EBML Header at %") TPRId64 T(" in %s"), EBML_ElementPosition(Segment), EBML_ElementPosition(EbmlHead), Path);
                EbmlHead = Segment;
            }
        } while (Segment!=NULL && !EL_Type(Segment, MATROSKA_getContextSegment()));

        if (Segment!=NULL && EL_Type(Segment, MATROSKA_getContextSegment()) && EbmlHead!=NULL && EL_Type(EbmlHead, EBML_getContextHead()))
        {
            SegmentStart currSegment;
            currSegment.EbmlHeadPos = EBML_ElementPosition(EbmlHead);
            currSegment.SegmentPos = EBML_ElementPosition(Segment);

            if (EBML_ElementIsFiniteSize(EbmlHead))
                currSegment.EbmlSize = EBML_ElementFullSize(EbmlHead, 1);
            else
                currSegment.EbmlSize = EBML_ElementPosition(Segment) - EBML_ElementPosition(EbmlHead); // TODO: we should write the proper size in the header if there is enough room
            NodeDelete((node*)EbmlHead);

            EbmlHead = EBML_ElementSkipData(Segment, Input, &RContext, NULL, 1);

            if (EBML_ElementIsFiniteSize(Segment))
                currSegment.SegmentSize = EBML_ElementFullSize(Segment, 1);
            else { // TODO: we should write the proper size in the segment if there is enough room
                if (EbmlHead!=NULL)
                    currSegment.SegmentSize = EBML_ElementPosition(EbmlHead) - EBML_ElementPosition(Segment);
                else
                    currSegment.SegmentSize = Stream_Seek(Input,0,SEEK_CUR);
            }
            NodeDelete((node*)Segment);

            ArrayAppend(&SegmentStarts, &currSegment, sizeof(currSegment), 0);
        }

        if (EbmlHead==NULL)
            EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    }

    if (!Quiet) TextWrite(StdErr,T("\r\n"));

    if (ARRAYCOUNT(SegmentStarts, SegmentStart)==0)
        Result = OutputError(3,T("No segment found in %s"), Path);
    else if (ARRAYCOUNT(SegmentStarts, SegmentStart)==1)
        Result = OutputWarning(3,T("Only one segment found in %s, do nothing"), Path);
    else {
        tchar_t OutPath[MAXPATHFULL];
        tchar_t Original[MAXLINE], String[MAXLINE], Ext[MAXDATA];

        // TODO: copy each segment in a separate file
        for (size_t j=0; j<ARRAYCOUNT(SegmentStarts, SegmentStart); ++j)
        {
            SegmentStart *seg = ARRAYBEGIN(SegmentStarts, SegmentStart)+j;
            if (!Quiet) TextPrintf(StdErr,T("write segment %zu from %s %") TPRId64 T(" size %") TPRId64 T(" in %s\r\n"), j, Path, seg->EbmlHeadPos, seg->EbmlSize+seg->SegmentSize, Path);

            SplitPath(Path,Original,TSIZEOF(Original),String,TSIZEOF(String),Ext,TSIZEOF(Ext));
            if (!Original[0])
                OutPath[0] = 0;
            else
            {
                tcscpy_s(OutPath,TSIZEOF(OutPath),Original);
                AddPathDelimiter(OutPath,TSIZEOF(OutPath));
            }
            if (Ext[0])
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%s.%zu.%s"),String,j,Ext);
            else
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%zu.%s"),j,String);

            Output = StreamOpen(&p,OutPath,SFLAG_WRONLY|SFLAG_CREATE);
            if (!Output)
            {
                Result = OutputError(5,T("Could not open file \"%s\" for writing\r\n"),OutPath);
                goto exit;
            }

            CopyTo(Input, Output, seg->EbmlHeadPos, seg->EbmlSize);
            CopyTo(Input, Output, seg->SegmentPos, seg->SegmentSize);

            StreamClose(Output);
        }
    }

exit:
    ArrayClear(&SegmentStarts);
    if (Input)
        StreamClose(Input);
    if (Output)
        StreamClose(Output);

    // Core-C ending
    ParserContext_Done(&p);

    return Result;
}